

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_outbound_item * nghttp2_session_pop_next_ob_item(nghttp2_session *session)

{
  int iVar1;
  nghttp2_outbound_item *pnVar2;
  nghttp2_session *in_RDI;
  nghttp2_outbound_item *item;
  nghttp2_session *in_stack_fffffffffffffff8;
  
  pnVar2 = (in_RDI->ob_urgent).head;
  if (pnVar2 == (nghttp2_outbound_item *)0x0) {
    pnVar2 = (in_RDI->ob_reg).head;
    if (pnVar2 == (nghttp2_outbound_item *)0x0) {
      iVar1 = session_is_outgoing_concurrent_streams_max(in_RDI);
      if ((iVar1 == 0) && (pnVar2 = (in_RDI->ob_syn).head, pnVar2 != (nghttp2_outbound_item *)0x0))
      {
        nghttp2_outbound_queue_pop(&in_RDI->ob_syn);
        pnVar2->queued = '\0';
      }
      else if (in_RDI->remote_window_size < 1) {
        pnVar2 = (nghttp2_outbound_item *)0x0;
      }
      else {
        pnVar2 = nghttp2_stream_next_outbound_item((nghttp2_stream *)in_stack_fffffffffffffff8);
        if (pnVar2 == (nghttp2_outbound_item *)0x0) {
          pnVar2 = session_sched_get_next_outbound_item(in_stack_fffffffffffffff8);
        }
      }
    }
    else {
      nghttp2_outbound_queue_pop(&in_RDI->ob_reg);
      pnVar2->queued = '\0';
    }
  }
  else {
    nghttp2_outbound_queue_pop(&in_RDI->ob_urgent);
    pnVar2->queued = '\0';
  }
  return pnVar2;
}

Assistant:

nghttp2_outbound_item *
nghttp2_session_pop_next_ob_item(nghttp2_session *session) {
  nghttp2_outbound_item *item;

  item = nghttp2_outbound_queue_top(&session->ob_urgent);
  if (item) {
    nghttp2_outbound_queue_pop(&session->ob_urgent);
    item->queued = 0;
    return item;
  }

  item = nghttp2_outbound_queue_top(&session->ob_reg);
  if (item) {
    nghttp2_outbound_queue_pop(&session->ob_reg);
    item->queued = 0;
    return item;
  }

  if (!session_is_outgoing_concurrent_streams_max(session)) {
    item = nghttp2_outbound_queue_top(&session->ob_syn);
    if (item) {
      nghttp2_outbound_queue_pop(&session->ob_syn);
      item->queued = 0;
      return item;
    }
  }

  if (session->remote_window_size > 0) {
    item = nghttp2_stream_next_outbound_item(&session->root);
    if (item) {
      return item;
    }

    return session_sched_get_next_outbound_item(session);
  }

  return NULL;
}